

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

bool_t bf_put_float64_le(bfile_t *bfile,float64_t value)

{
  bf_put_uint8(bfile,SUB81(value,0));
  bf_put_uint8(bfile,(uint8_t)((ulong)value >> 8));
  bf_put_uint8(bfile,(uint8_t)((ulong)value >> 0x10));
  bf_put_uint8(bfile,(uint8_t)((ulong)value >> 0x18));
  bf_put_uint8(bfile,(uint8_t)((ulong)value >> 0x20));
  bf_put_uint8(bfile,(uint8_t)((ulong)value >> 0x28));
  bf_put_uint8(bfile,(uint8_t)((ulong)value >> 0x30));
  bf_put_uint8(bfile,(uint8_t)((ulong)value >> 0x38));
  return 1;
}

Assistant:

bool_t
bf_put_float64_le(
    bfile_t * bfile,
    float64_t value )
{
    union {
        float64_t real;
        uint8_t   bytes[8];
    } data;

    assert( bfile != NULL );
    data.real = value;

#ifndef WORDS_BIGENDIAN
    bf_put_uint8( bfile, data.bytes[0] );
    bf_put_uint8( bfile, data.bytes[1] );
    bf_put_uint8( bfile, data.bytes[2] );
    bf_put_uint8( bfile, data.bytes[3] );
    bf_put_uint8( bfile, data.bytes[4] );
    bf_put_uint8( bfile, data.bytes[5] );
    bf_put_uint8( bfile, data.bytes[6] );
    bf_put_uint8( bfile, data.bytes[7] );
#else /* WORDS_BIGENDIAN */
    bf_put_uint8( bfile, data.bytes[7] );
    bf_put_uint8( bfile, data.bytes[6] );
    bf_put_uint8( bfile, data.bytes[5] );
    bf_put_uint8( bfile, data.bytes[4] );
    bf_put_uint8( bfile, data.bytes[3] );
    bf_put_uint8( bfile, data.bytes[2] );
    bf_put_uint8( bfile, data.bytes[1] );
    bf_put_uint8( bfile, data.bytes[0] );
#endif /* WORDS_BIGENDIAN */

    return TRUE;
}